

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention_unittest.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::compiler::anon_unknown_0::RetentionStripTest::ParseSchema
          (RetentionStripTest *this,string_view contents,string_view file_name)

{
  string *psVar1;
  bool bVar2;
  Descriptor *pDVar3;
  FileDescriptor *pFVar4;
  InternalMetadata arena;
  Arg *in_R9;
  string_view format;
  FakeErrorCollector error_collector;
  LogMessageFatal local_2b8;
  string proto_file;
  ArrayInputStream input_stream;
  Parser parser;
  FileDescriptorProto file_descriptor;
  Tokenizer tokenizer;
  
  pDVar3 = FileDescriptorSet::GetDescriptor();
  psVar1 = pDVar3->file_->name_;
  file_descriptor.super_Message.super_MessageLite._internal_metadata_.ptr_ =
       (intptr_t)(psVar1->_M_dataplus)._M_p;
  file_descriptor.super_Message.super_MessageLite._vptr_MessageLite =
       (_func_int **)psVar1->_M_string_length;
  format._M_str = (char *)&file_descriptor;
  format._M_len =
       (size_t)
       "\n          syntax = \"proto2\";\n\n          package google.protobuf.internal;\n\n          import \"$0\";\n\n          $1\n        "
  ;
  tokenizer.current_._0_8_ = contents._M_len;
  tokenizer.current_.text._M_dataplus._M_p = contents._M_str;
  absl::lts_20250127::Substitute_abi_cxx11_
            (&proto_file,(lts_20250127 *)0x79,format,(Arg *)&tokenizer,in_R9);
  io::ArrayInputStream::ArrayInputStream
            (&input_stream,proto_file._M_dataplus._M_p,(int)proto_file._M_string_length,-1);
  error_collector.super_ErrorCollector._vptr_ErrorCollector =
       (ErrorCollector)&PTR__ErrorCollector_0165e440;
  io::Tokenizer::Tokenizer
            (&tokenizer,&input_stream.super_ZeroCopyInputStream,
             &error_collector.super_ErrorCollector);
  Parser::Parser(&parser);
  parser.error_collector_ = &error_collector.super_ErrorCollector;
  FileDescriptorProto::FileDescriptorProto(&file_descriptor);
  bVar2 = Parser::Parse(&parser,&tokenizer,&file_descriptor);
  if (bVar2) {
    file_descriptor.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
         file_descriptor.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
    arena = file_descriptor.super_Message.super_MessageLite._internal_metadata_;
    if ((file_descriptor.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      arena.ptr_ = *(undefined8 *)
                    (file_descriptor.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                    0xfffffffffffffffe);
    }
    protobuf::internal::ArenaStringPtr::Set
              (&file_descriptor.field_0._impl_.name_,file_name,(Arena *)arena.ptr_);
    pFVar4 = DescriptorPool::BuildFile(&this->pool_,&file_descriptor);
    FileDescriptorProto::~FileDescriptorProto(&file_descriptor);
    Parser::~Parser(&parser);
    io::Tokenizer::~Tokenizer(&tokenizer);
    io::ErrorCollector::~ErrorCollector(&error_collector.super_ErrorCollector);
    std::__cxx11::string::~string((string *)&proto_file);
    return pFVar4;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_2b8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/retention_unittest.cc"
             ,0x50,"parser.Parse(&tokenizer, &file_descriptor)");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_2b8);
}

Assistant:

const FileDescriptor* ParseSchema(absl::string_view contents,
                                    absl::string_view file_name = "foo.proto") {
    std::string proto_file = absl::Substitute(
        R"schema(
          syntax = "proto2";

          package google.protobuf.internal;

          import "$0";

          $1
        )schema",
        FileDescriptorSet::descriptor()->file()->name(), contents);
    io::ArrayInputStream input_stream(proto_file.data(),
                                      static_cast<int>(proto_file.size()));
    FakeErrorCollector error_collector;
    io::Tokenizer tokenizer(&input_stream, &error_collector);
    Parser parser;
    parser.RecordErrorsTo(&error_collector);
    FileDescriptorProto file_descriptor;
    ABSL_CHECK(parser.Parse(&tokenizer, &file_descriptor));
    file_descriptor.set_name(file_name);

    return pool_.BuildFile(file_descriptor);
  }